

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containersNative.cpp
# Opt level: O3

PackageInfo * chatra::emb::containers::packageInfo(void)

{
  char *pcVar1;
  char *pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined1 *puVar4;
  PackageInfo *in_RDI;
  long lVar5;
  initializer_list<chatra::Script> __l;
  initializer_list<chatra::NativeCallHandlerInfo> __l_00;
  undefined1 local_548 [16];
  undefined1 local_538 [16];
  undefined4 local_528;
  undefined4 uStack_524;
  undefined1 local_520 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_510;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0;
  code *local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  uint local_4c8 [2];
  undefined4 uStack_4c0;
  undefined4 uStack_4bc;
  uint *local_4b8;
  undefined8 local_4b0;
  uint local_4a8 [2];
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  undefined1 *local_498;
  undefined8 local_490;
  undefined1 local_488 [16];
  code *local_478;
  uint *local_470;
  undefined8 local_468;
  uint local_460 [2];
  undefined4 uStack_458;
  undefined4 uStack_454;
  uint *local_450;
  undefined8 local_448;
  uint local_440 [2];
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined1 *local_430;
  undefined8 local_428;
  undefined1 local_420 [16];
  code *local_410;
  uint *local_408;
  undefined8 local_400;
  uint local_3f8 [2];
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  uint *local_3e8;
  undefined8 local_3e0;
  uint local_3d8 [2];
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined1 *local_3c8;
  undefined8 local_3c0;
  undefined1 local_3b8 [16];
  code *local_3a8;
  uint *local_3a0;
  undefined8 local_398;
  uint local_390 [2];
  undefined4 uStack_388;
  undefined4 uStack_384;
  uint *local_380;
  undefined8 local_378;
  uint local_370 [2];
  undefined4 uStack_368;
  undefined4 uStack_364;
  undefined1 *local_360;
  undefined8 local_358;
  undefined1 local_350 [16];
  code *local_340;
  uint *local_338;
  undefined8 local_330;
  uint local_328 [2];
  undefined4 uStack_320;
  undefined4 uStack_31c;
  char *local_318;
  size_type local_310;
  char local_308 [8];
  undefined4 uStack_300;
  undefined4 uStack_2fc;
  undefined1 *local_2f8;
  undefined8 local_2f0;
  undefined1 local_2e8 [16];
  code *local_2d8;
  char *local_2d0;
  size_type local_2c8;
  char local_2c0 [8];
  undefined8 uStack_2b8;
  undefined1 *local_2b0;
  undefined8 local_2a8;
  undefined1 local_2a0 [8];
  undefined8 uStack_298;
  undefined1 *local_290;
  undefined8 local_288;
  undefined1 local_280 [16];
  undefined1 local_270 [8];
  vector<chatra::Script,_std::allocator<chatra::Script>_> scripts;
  vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> handlers;
  undefined1 local_230 [16];
  char *local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Alloc_hider _Stack_208;
  char *local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  char *local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  undefined8 uStack_1c8;
  undefined1 *local_1c0;
  undefined8 local_1b8;
  undefined1 local_1b0 [8];
  undefined8 uStack_1a8;
  uint *local_1a0;
  NativeCallHandler local_198;
  uint local_190 [2];
  undefined4 uStack_188;
  undefined4 uStack_184;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  undefined8 local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  uint *local_160;
  undefined8 local_158;
  uint local_150 [2];
  undefined4 uStack_148;
  undefined4 uStack_144;
  uint *local_140;
  undefined8 local_138;
  uint local_130 [2];
  undefined4 uStack_128;
  undefined4 uStack_124;
  uint *local_120;
  undefined8 local_118;
  uint local_110 [2];
  undefined4 uStack_108;
  undefined4 uStack_104;
  uint *local_100;
  undefined8 local_f8;
  uint local_f0 [2];
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  uint *local_e0;
  undefined8 local_d8;
  uint local_d0 [2];
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  uint *local_c0;
  undefined8 local_b8;
  uint local_b0 [2];
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  uint *local_a0;
  undefined8 local_98;
  uint local_90 [2];
  undefined4 uStack_88;
  undefined4 uStack_84;
  uint *local_80;
  undefined8 local_78;
  uint local_70 [2];
  undefined4 uStack_68;
  undefined4 uStack_64;
  uint *local_60;
  undefined8 local_58;
  uint local_50 [2];
  undefined4 uStack_48;
  undefined4 uStack_44;
  PackageInfo *local_40;
  allocator_type local_31;
  
  handlers.
  super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_230;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &handlers.
              super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"containers","");
  pcVar1 = local_218._M_local_buf + 8;
  local_220 = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_220,
             "\n/*\n * Programming language \'Chatra\' reference implementation\n *\n * Copyright(C) 2019-2020 Chatra Project Team\n *\n * Licensed under the Apache License, Version 2.0 (the \"License\");\n * you may not use this file except in compliance with the License.\n * You may obtain a copy of the License at\n *\n *   http://www.apache.org/licenses/LICENSE-2.0\n *\n * Unless required by applicable law or agreed to in writing, software\n * distributed under the License is distributed on an \"AS IS\" BASIS,\n * WITHOUT WARRANTIES OR CONDITIONS OF ANY KIND, either express or implied.\n * See the License for the specific language governing permissions and\n * limitations under the License.\n *\n * author: Satoshi Hosokawa (chatra.hosokawa@gmail.com)\n */\n\nclass ByteArray extends VariableLengthSequence\n\tdef _init_instance() as native\n\tdef _init_instance(value) as native\n\n\tdef init()\n\t\tsuper()\n\t\t_init_instance()\n\n\tdef init(value: String)\n\t\tsuper()\n\t\t_init_instance(value)\n\n\tdef init(value: ByteArray)\n\t\tsuper()\n\t\t_init_instance(value)\n\n\tdef size() as native\n\n\tdef _native_resize(a0) as native\n\n\tdef resize(newSize: Int)\n\t\t_native_resize(newSize)\n\t\treturn self\n\n\tdef has(value)\n\t\tt0 = size()\n\t\tt1 = 0\n\t\twhile t1 < t0\n\t\t\tif _native_at(t1++) == value\n\t\t\t\treturn true\n\t\treturn false\n\n\tdef _native_add(a0) as native\n\n\tdef add(a0...;)\n\t\tt0 = a0.size()\n\t\tt1 = 0\n\t\twhile t1 < t0\n\t\t\t_native_add(a0[t1++])\n\t\treturn self\n\n\tdef add(a0)\n\t\t_native_add(a0)\n\t\treturn self\n\n\tdef append(a0)\n\t\tif a0 == null\n\t\t\treturn self\n\t\tfor t0 in a0\n\t\t\tadd(t0)\n\t\treturn self\n\n\tdef _native_insert(a0, a1) as native\n\n\tdef insert(position: Int, a0...;)\n\t\tt0 = a0.size()\n\t\tt1 = 0\n\t\twhile t1 < t0\n\t\t\t_native_insert(position + t1, a0[t1])\n\t\t\tt1++\n\t\treturn self\n\n\tdef insert(position: Int, a0)\n\t\t_native_insert(position, a0)\n\t\treturn self\n\n\tdef _native_at(a0) as native\n\n\tdef (position: Int)\n\t\treturn _native_at(position)\n\n\tdef _native_at(a0, a1) as native\n\n\tdef (position: Int).set(r)\n\t\treturn _native_at(position, r)\n\n\tdef remove(position: Int) as native\n\n\tdef remove(a0: IndexSet)\n\t\tt0 = Array()\n\t\tif a0.fi..." /* TRUNCATED STRING LITERAL */
             ,"");
  if (handlers.
      super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)local_230) {
    local_538._8_8_ = local_230._8_8_;
    local_548._0_8_ = (pointer)local_538;
  }
  else {
    local_548._0_8_ =
         handlers.
         super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  local_230[0] = 0;
  if (local_220 == pcVar1) {
    aStack_510._0_8_ = _Stack_208._M_p;
    _local_528 = local_520 + 8;
  }
  else {
    _local_528 = local_220;
  }
  local_520._0_8_ = local_218._M_allocated_capacity;
  local_218._M_allocated_capacity = 0;
  local_218._M_local_buf[8] = '\0';
  __l._M_len = 1;
  __l._M_array = (iterator)local_548;
  handlers.
  super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_230;
  local_220 = pcVar1;
  local_40 = in_RDI;
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_270,__l,
             (allocator_type *)
             &scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if ((undefined1 *)_local_528 != local_520 + 8) {
    operator_delete((void *)_local_528);
  }
  if ((pointer)local_548._0_8_ != (pointer)local_538) {
    operator_delete((void *)local_548._0_8_);
  }
  if (local_220 != pcVar1) {
    operator_delete(local_220);
  }
  if (handlers.
      super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)local_230) {
    operator_delete(handlers.
                    super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  local_1a0 = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"ByteArray","");
  local_180 = &local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"_init_instance","");
  local_548._8_8_ = local_538 + 8;
  local_548._0_8_ = byteArray_initInstance;
  if (local_1a0 == local_190) {
    uStack_524 = uStack_184;
    local_528 = uStack_188;
  }
  else {
    local_548._8_8_ = local_1a0;
  }
  local_520._0_8_ = &aStack_510;
  local_538._0_8_ = local_198;
  local_198 = (NativeCallHandler)0x0;
  local_190[0] = local_190[0] & 0xffffff00;
  if (local_180 == &local_170) {
    aStack_510._8_4_ = local_170._8_4_;
    aStack_510._12_4_ = local_170._12_4_;
  }
  else {
    local_520._0_8_ = local_180;
  }
  local_500._M_allocated_capacity = (size_type)&local_4f0;
  local_520._8_8_ = local_178;
  local_178 = 0;
  local_170._M_allocated_capacity._0_4_ = local_170._M_allocated_capacity._0_4_ & 0xffffff00;
  local_500._8_8_ = 0;
  local_4f0._M_local_buf[0] = '\0';
  local_1a0 = local_190;
  local_180 = &local_170;
  local_160 = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"ByteArray","");
  local_140 = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"size","");
  local_4d8 = local_4c8;
  local_4e0 = byteArray_size;
  if (local_160 == local_150) {
    uStack_4c0 = uStack_148;
    uStack_4bc = uStack_144;
  }
  else {
    local_4d8 = local_160;
  }
  local_4b8 = local_4a8;
  local_4d0 = local_158;
  local_158 = 0;
  local_150[0] = local_150[0] & 0xffffff00;
  if (local_140 == local_130) {
    uStack_4a0 = uStack_128;
    uStack_49c = uStack_124;
  }
  else {
    local_4b8 = local_140;
  }
  local_498 = local_488;
  local_4b0 = local_138;
  local_138 = 0;
  local_130[0] = local_130[0] & 0xffffff00;
  local_490 = 0;
  local_488[0] = 0;
  local_160 = local_150;
  local_140 = local_130;
  local_120 = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"ByteArray","");
  local_100 = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"_native_resize","");
  local_470 = local_460;
  local_478 = byteArray_resize;
  if (local_120 == local_110) {
    uStack_458 = uStack_108;
    uStack_454 = uStack_104;
  }
  else {
    local_470 = local_120;
  }
  local_450 = local_440;
  local_468 = local_118;
  local_118 = 0;
  local_110[0] = local_110[0] & 0xffffff00;
  if (local_100 == local_f0) {
    uStack_438 = uStack_e8;
    uStack_434 = uStack_e4;
  }
  else {
    local_450 = local_100;
  }
  local_430 = local_420;
  local_448 = local_f8;
  local_f8 = 0;
  local_f0[0] = local_f0[0] & 0xffffff00;
  local_428 = 0;
  local_420[0] = 0;
  local_120 = local_110;
  local_100 = local_f0;
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"ByteArray","");
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"_native_add","");
  local_408 = local_3f8;
  local_410 = byteArray_add;
  if (local_e0 == local_d0) {
    uStack_3f0 = uStack_c8;
    uStack_3ec = uStack_c4;
  }
  else {
    local_408 = local_e0;
  }
  local_3e8 = local_3d8;
  local_400 = local_d8;
  local_d8 = 0;
  local_d0[0] = local_d0[0] & 0xffffff00;
  if (local_c0 == local_b0) {
    uStack_3d0 = uStack_a8;
    uStack_3cc = uStack_a4;
  }
  else {
    local_3e8 = local_c0;
  }
  local_3c8 = local_3b8;
  local_3e0 = local_b8;
  local_b8 = 0;
  local_b0[0] = local_b0[0] & 0xffffff00;
  local_3c0 = 0;
  local_3b8[0] = 0;
  local_e0 = local_d0;
  local_c0 = local_b0;
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"ByteArray","");
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"_native_insert","");
  local_3a0 = local_390;
  local_3a8 = byteArray_insert;
  if (local_a0 == local_90) {
    uStack_388 = uStack_88;
    uStack_384 = uStack_84;
  }
  else {
    local_3a0 = local_a0;
  }
  local_380 = local_370;
  local_398 = local_98;
  local_98 = 0;
  local_90[0] = local_90[0] & 0xffffff00;
  if (local_80 == local_70) {
    uStack_368 = uStack_68;
    uStack_364 = uStack_64;
  }
  else {
    local_380 = local_80;
  }
  local_360 = local_350;
  local_378 = local_78;
  local_78 = 0;
  local_70[0] = local_70[0] & 0xffffff00;
  local_358 = 0;
  local_350[0] = 0;
  local_a0 = local_90;
  local_80 = local_70;
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"ByteArray","");
  pcVar1 = local_1f8._M_local_buf + 8;
  local_200 = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"_native_at","");
  local_338 = local_328;
  local_340 = byteArray_at;
  if (local_60 == local_50) {
    uStack_320 = uStack_48;
    uStack_31c = uStack_44;
  }
  else {
    local_338 = local_60;
  }
  local_318 = local_308;
  local_330 = local_58;
  local_58 = 0;
  local_50[0] = local_50[0] & 0xffffff00;
  if (local_200 == pcVar1) {
    uStack_300 = uStack_1e8;
    uStack_2fc = uStack_1e4;
  }
  else {
    local_318 = local_200;
  }
  local_2f8 = local_2e8;
  local_310 = local_1f8._M_allocated_capacity;
  local_1f8._M_allocated_capacity = 0;
  local_1f8._8_4_ = local_1f8._8_4_ & 0xffffff00;
  local_2f0 = 0;
  local_2e8[0] = 0;
  pcVar2 = local_1d8._M_local_buf + 8;
  local_200 = pcVar1;
  local_1e0 = pcVar2;
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"ByteArray","");
  local_1c0 = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"remove","");
  local_2d0 = local_2c0;
  local_2d8 = byteArray_remove;
  if (local_1e0 == pcVar2) {
    uStack_2b8 = uStack_1c8;
  }
  else {
    local_2d0 = local_1e0;
  }
  local_2b0 = local_2a0;
  local_2c8 = local_1d8._M_allocated_capacity;
  local_1d8._M_allocated_capacity = 0;
  local_1d8._M_local_buf[8] = '\0';
  if (local_1c0 == local_1b0) {
    uStack_298 = uStack_1a8;
  }
  else {
    local_2b0 = local_1c0;
  }
  puVar4 = local_280;
  local_2a8 = local_1b8;
  local_1b8 = 0;
  local_1b0[0] = 0;
  local_288 = 0;
  local_280[0] = 0;
  __l_00._M_len = 7;
  __l_00._M_array = (iterator)local_548;
  local_290 = puVar4;
  local_1e0 = pcVar2;
  local_1c0 = local_1b0;
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::vector
            ((vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              *)&scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage,__l_00,&local_31);
  lVar5 = -0x2d8;
  do {
    if (puVar4 != *(undefined1 **)(puVar4 + -0x10)) {
      operator_delete(*(undefined1 **)(puVar4 + -0x10));
    }
    if (puVar4 + -0x20 != *(undefined1 **)(puVar4 + -0x30)) {
      operator_delete(*(undefined1 **)(puVar4 + -0x30));
    }
    if (puVar4 + -0x40 != *(undefined1 **)(puVar4 + -0x50)) {
      operator_delete(*(undefined1 **)(puVar4 + -0x50));
    }
    puVar4 = puVar4 + -0x68;
    lVar5 = lVar5 + 0x68;
  } while (lVar5 != 0);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  if (local_1e0 != pcVar2) {
    operator_delete(local_1e0);
  }
  if (local_200 != pcVar1) {
    operator_delete(local_200);
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0);
  }
  if (local_100 != local_f0) {
    operator_delete(local_100);
  }
  if (local_120 != local_110) {
    operator_delete(local_120);
  }
  if (local_140 != local_130) {
    operator_delete(local_140);
  }
  if (local_160 != local_150) {
    operator_delete(local_160);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180);
  }
  if (local_1a0 != local_190) {
    operator_delete(local_1a0);
  }
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
            (&local_40->scripts,(vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_270
            );
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::vector
            (&local_40->handlers,
             (vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              *)&scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage);
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002479a0;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR__IPackage_002479f0;
  (local_40->interface).super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var3 + 1);
  (local_40->interface).super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var3;
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::
  ~vector((vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> *)
          &scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage);
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::~vector
            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_270);
  return local_40;
}

Assistant:

PackageInfo packageInfo() {
	std::vector<Script> scripts = {{"containers", script}};
	std::vector<HandlerInfo> handlers = {
			{byteArray_initInstance, "ByteArray", "_init_instance"},
			{byteArray_size, "ByteArray", "size"},
			{byteArray_resize, "ByteArray", "_native_resize"},
			{byteArray_add, "ByteArray", "_native_add"},
			{byteArray_insert, "ByteArray", "_native_insert"},
			{byteArray_at, "ByteArray", "_native_at"},
			{byteArray_remove, "ByteArray", "remove"},
	};
	return {scripts, handlers, std::make_shared<ContainersPackageInterface>()};
}